

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

bool __thiscall helics::BrokerBase::getFlagValue(BrokerBase *this,int32_t flag)

{
  int in_ESI;
  long in_RDI;
  int iVar1;
  undefined1 local_1;
  
  if (in_ESI == 0x58) {
    iVar1 = in_ESI;
    CLI::std::__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x44fa25);
    local_1 = std::atomic<bool>::load
                        ((atomic<bool> *)CONCAT44(iVar1,in_ESI),
                         (memory_order)((ulong)in_RDI >> 0x20));
  }
  else if (in_ESI == 0x59) {
    local_1 = (bool)(*(byte *)(in_RDI + 0xda) & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BrokerBase::getFlagValue(int32_t flag) const
{
    switch (flag) {
        case HELICS_FLAG_DUMPLOG:
            return dumplog;
        case HELICS_FLAG_FORCE_LOGGING_FLUSH:
            return mLogManager->forceLoggingFlush.load();
        default:
            return false;
    }
}